

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * add_slash(char *path)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDI;
  char *p;
  size_t len;
  undefined8 local_8;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 == 0) {
    local_8 = (char *)0x0;
  }
  else {
    pcVar2 = point_basename(in_RDI);
    local_8 = in_RDI;
    if (*pcVar2 != '\0') {
      strcat(in_RDI,G_SLASH_CHAR);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

char *add_slash(char *path)
{
	size_t len = strlen(path);
	if (len == 0)
	{
		return NULL;
	}
	char *p = point_basename((const char *)path);
	if (*p != '\0')
	{
		strcat(path, G_SLASH_CHAR);
	}
	return path;
}